

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

void lj_snap_purge(jit_State *J)

{
  long in_RDI;
  BCReg maxslot;
  BCReg s;
  uint8_t udf [255];
  uint local_110;
  uint local_10c;
  uint8_t local_108 [60];
  BCReg in_stack_ffffffffffffff34;
  BCIns *in_stack_ffffffffffffff38;
  uint8_t *in_stack_ffffffffffffff40;
  jit_State *in_stack_ffffffffffffff48;
  
  local_110 = *(uint *)(in_RDI + 0x94);
  if (((**(uint **)(in_RDI + 0x70) & 0xff) == 0x5c) &&
     (*(byte *)(*(long *)(in_RDI + 0x80) + 6) < local_110)) {
    local_110 = (uint)*(byte *)(*(long *)(in_RDI + 0x80) + 6);
  }
  local_10c = snap_usedef(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                          in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
  if (local_10c < local_110) {
    snap_useuv(*(GCproto **)(in_RDI + 0x80),local_108);
    for (; local_10c < local_110; local_10c = local_10c + 1) {
      if (local_108[local_10c] != '\0') {
        *(undefined4 *)(*(long *)(in_RDI + 0x88) + (ulong)local_10c * 4) = 0;
      }
    }
  }
  return;
}

Assistant:

void lj_snap_purge(jit_State *J)
{
  uint8_t udf[SNAP_USEDEF_SLOTS];
  BCReg s, maxslot = J->maxslot;
  if (bc_op(*J->pc) == BC_FUNCV && maxslot > J->pt->numparams)
    maxslot = J->pt->numparams;
  s = snap_usedef(J, udf, J->pc, maxslot);
  if (s < maxslot) {
    snap_useuv(J->pt, udf);
    for (; s < maxslot; s++)
      if (udf[s] != 0)
	J->base[s] = 0;  /* Purge dead slots. */
  }
}